

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printArgList
          (PrinterStream *this,ArrayView<soul::pool_ref<soul::heart::Expression>_> *args)

{
  bool bVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  Expression *e;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> *__range2;
  bool isFirst;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> *args_local;
  PrinterStream *this_local;
  
  bVar1 = ArrayView<soul::pool_ref<soul::heart::Expression>_>::empty(args);
  if (bVar1) {
    choc::text::CodePrinter::operator<<(this->out,"()");
  }
  else {
    choc::text::CodePrinter::operator<<(this->out," (");
    bVar1 = true;
    __end2 = ArrayView<soul::pool_ref<soul::heart::Expression>_>::begin(args);
    ppVar2 = ArrayView<soul::pool_ref<soul::heart::Expression>_>::end(args);
    for (; __end2 != ppVar2; __end2 = __end2 + 1) {
      if (bVar1) {
        bVar1 = false;
      }
      else {
        choc::text::CodePrinter::operator<<(this->out,", ");
      }
      e = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
      printExpression(this,e);
    }
    choc::text::CodePrinter::operator<<(this->out,')');
  }
  return;
}

Assistant:

void printArgList (const ArrayView<pool_ref<heart::Expression>>& args)
        {
            if (args.empty())
            {
                out << "()";
                return;
            }

            out << " (";
            bool isFirst = true;

            for (auto& arg : args)
            {
                if (isFirst)
                    isFirst = false;
                else
                    out << ", ";

                printExpression (arg);
            }

            out << ')';
        }